

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Gridded_Data_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Gridded_Data_PDU *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pKVar2;
  pointer pKVar3;
  KString *pKVar4;
  ostream *poVar5;
  KINT32 Value;
  KINT32 Value_00;
  pointer pKVar6;
  pointer pKVar7;
  KStringStream ss;
  KString local_280;
  KString *local_260;
  KString local_258;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_280,&this->super_Header);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_280._M_dataplus._M_p,local_280._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"-Gridded Data PDU-\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Environmental Process ID:\n",0x1a);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1d8,&this->m_EnvProcID);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Field Number: ",0xe);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"PDU Number: ",0xc);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"PDU Total: ",0xb);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Coordinate System: ",0x13);
  DATA_TYPE::ENUMS::GetEnumAsStringCoordinateSystem_abi_cxx11_
            (&local_1f8,(ENUMS *)(ulong)this->m_ui16CordSys,Value);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Number Of Axis: ",0x10);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Constant Grid: ",0xf);
  DATA_TYPE::ENUMS::GetEnumAsStringConstantGrid_abi_cxx11_
            (&local_218,(ENUMS *)(ulong)this->m_ui8ConstGrid,Value_00);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Environment Type: ",0x12);
  DATA_TYPE::EnvironmentType::GetAsString_abi_cxx11_(&local_238,&this->m_EnvType);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_238._M_dataplus._M_p,local_238._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Orientation: ",0xd);
  DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_(&local_258,&this->m_Ori);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_258._M_dataplus._M_p,local_258._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Sample Time: ",0xd);
  poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Total Values: ",0xe);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Vector Dimension: ",0x12);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_280.field_2;
  local_260 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  pKVar6 = (this->m_vpGridAxisDesc).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vpGridAxisDesc).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pKVar6 != pKVar2) {
    do {
      (*(pKVar6->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_280);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_280._M_dataplus._M_p,local_280._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != paVar1) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      pKVar6 = pKVar6 + 1;
    } while (pKVar6 != pKVar2);
  }
  pKVar7 = (this->m_vGridData).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar3 = (this->m_vGridData).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pKVar7 != pKVar3) {
    do {
      (*(pKVar7->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_280);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_280._M_dataplus._M_p,local_280._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != paVar1) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      pKVar7 = pKVar7 + 1;
    } while (pKVar7 != pKVar3);
  }
  pKVar4 = local_260;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar4;
}

Assistant:

KString Gridded_Data_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Gridded Data PDU-\n"
       << "Environmental Process ID:\n"
       << m_EnvProcID.GetAsString()
       << "Field Number: "      << m_ui16FieldNum                                   << "\n"
       << "PDU Number: "        << m_ui16PDUNum                                     << "\n"
       << "PDU Total: "         << m_ui16PDUTotal                                   << "\n"
       << "Coordinate System: " << GetEnumAsStringCoordinateSystem( m_ui16CordSys ) << "\n"
       << "Number Of Axis: "    <<  ( KUINT16 )m_ui8NumAxis                         << "\n"
       << "Constant Grid: "     << GetEnumAsStringConstantGrid( m_ui8ConstGrid )    << "\n"
       << "Environment Type: "  << m_EnvType.GetAsString()
       << "Orientation: "       << m_Ori.GetAsString()
       << "Sample Time: "       << m_ui64SampleTime                                 << "\n"
       << "Total Values: "      << m_ui32TotalValues                                << "\n"
       << "Vector Dimension: "  << ( KUINT16 )m_ui8VecDim                           << "\n";

    vector<GridAxisDescriptor>::const_iterator citrAxis = m_vpGridAxisDesc.begin();
    vector<GridAxisDescriptor>::const_iterator citrAxisEnd = m_vpGridAxisDesc.end();
    for( ; citrAxis != citrAxisEnd; ++citrAxis )
    {
        ss << ( *citrAxis )->GetAsString();
    }

    vector<GridDataPtr>::const_iterator citrData = m_vGridData.begin();
    vector<GridDataPtr>::const_iterator citrDataEnd = m_vGridData.end();
    for( ; citrData != citrDataEnd; ++citrData )
    {
        ss << ( *citrData )->GetAsString();
    }

    return ss.str();
}